

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectorySnapshot.cpp
# Opt level: O3

void __thiscall efsw::DirectorySnapshot::setDirectoryInfo(DirectorySnapshot *this,string *directory)

{
  FileInfo local_58;
  
  FileInfo::FileInfo(&local_58,directory);
  FileInfo::operator=(&this->DirectoryInfo,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.Filepath._M_dataplus._M_p != &local_58.Filepath.field_2) {
    operator_delete(local_58.Filepath._M_dataplus._M_p);
  }
  return;
}

Assistant:

void DirectorySnapshot::setDirectoryInfo( std::string directory ) {
	DirectoryInfo = FileInfo( directory );
}